

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

void __thiscall TArray<TabData,_TabData>::Resize(TArray<TabData,_TabData> *this,uint amount)

{
  uint uVar1;
  
  uVar1 = amount - this->Count;
  if (this->Count <= amount && uVar1 != 0) {
    Grow(this,uVar1);
    uVar1 = this->Count;
    if (uVar1 < amount) {
      memset(this->Array + uVar1,0,(ulong)(~uVar1 + amount) * 8 + 8);
    }
  }
  this->Count = amount;
  return;
}

Assistant:

void Resize (unsigned int amount)
	{
		if (Count < amount)
		{
			// Adding new entries
			Grow (amount - Count);
			for (unsigned int i = Count; i < amount; ++i)
			{
				::new((void *)&Array[i]) T;
			}
		}
		else if (Count != amount)
		{
			// Deleting old entries
			DoDelete (amount, Count - 1);
		}
		Count = amount;
	}